

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unredacted_debug_format_for_test.cc
# Opt level: O0

string * __thiscall
google::protobuf::util::UnredactedShortDebugFormatForTest_abi_cxx11_
          (string *__return_storage_ptr__,util *this,Message *message)

{
  ulong uVar1;
  char *pcVar2;
  undefined1 local_90 [8];
  Printer printer;
  Message *message_local;
  string *debug_string;
  
  printer.finder_._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TextFormat::Printer::Printer((Printer *)local_90);
  TextFormat::Printer::SetSingleLineMode((Printer *)local_90,true);
  TextFormat::Printer::SetExpandAny((Printer *)local_90,true);
  TextFormat::Printer::SetReportSensitiveFields
            ((Printer *)local_90,kUnredactedShortDebugFormatForTest);
  TextFormat::Printer::PrintToString((Printer *)local_90,(Message *)this,__return_storage_ptr__);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    if (*pcVar2 == ' ') {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
  }
  printer.finder_._7_1_ = 1;
  TextFormat::Printer::~Printer((Printer *)local_90);
  if ((printer.finder_._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnredactedShortDebugFormatForTest(const google::protobuf::Message& message) {
  std::string debug_string;

  google::protobuf::TextFormat::Printer printer;
  printer.SetSingleLineMode(true);
  printer.SetExpandAny(true);
  printer.SetReportSensitiveFields(
      internal::FieldReporterLevel::kUnredactedShortDebugFormatForTest);

  printer.PrintToString(message, &debug_string);
  // Single line mode currently might have an extra space at the end.
  if (!debug_string.empty() && debug_string[debug_string.size() - 1] == ' ') {
    debug_string.resize(debug_string.size() - 1);
  }

  return debug_string;
}